

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O0

Instr * __thiscall
wabt::interp::Istream::Read(Instr *__return_storage_ptr__,Istream *this,Offset *offset)

{
  uchar uVar1;
  Enum EVar2;
  uint uVar3;
  unsigned_long uVar4;
  float fVar5;
  double dVar6;
  v128 vVar7;
  Instr *instr;
  u64 local_3c;
  undefined8 local_34;
  u64 local_2c;
  undefined8 local_24;
  Opcode local_1c;
  Offset *local_18;
  Offset *offset_local;
  Istream *this_local;
  
  local_18 = offset;
  offset_local = (Offset *)this;
  EVar2 = ReadAt<unsigned_int>(this,offset);
  Opcode::Opcode(&local_1c,EVar2);
  (__return_storage_ptr__->op).enum_ = local_1c.enum_;
  EVar2 = Opcode::operator_cast_to_Enum(&__return_storage_ptr__->op);
  switch(EVar2) {
  case Unreachable:
  case Nop:
  case Return:
  case Drop:
  case RefNull:
    __return_storage_ptr__->kind = Imm_0_Op_0;
    break;
  case Block:
  case Loop:
  case If:
  case Else:
  case Try:
  case Catch:
  case Throw:
  case Rethrow:
  case BrOnExn:
  case End:
  case ReturnCall:
  case InterpData:
  case Invalid:
    break;
  case Br:
    __return_storage_ptr__->kind = Imm_Jump_Op_0;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    break;
  case BrIf:
  case BrTable:
  case InterpBrUnless:
    __return_storage_ptr__->kind = Imm_Jump_Op_1;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    break;
  case Call:
  case InterpCallImport:
    __return_storage_ptr__->kind = Imm_Index_Op_N;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    break;
  case CallIndirect:
  case ReturnCallIndirect:
    __return_storage_ptr__->kind = Imm_Index_Index_Op_N;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32x2.snd = uVar3;
    break;
  case Select:
  case SelectT:
    __return_storage_ptr__->kind = Imm_0_Op_3;
    break;
  case LocalGet:
  case GlobalGet:
  case MemorySize:
  case DataDrop:
  case ElemDrop:
  case TableSize:
  case RefFunc:
    __return_storage_ptr__->kind = Imm_Index_Op_0;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    break;
  case LocalSet:
  case LocalTee:
  case GlobalSet:
  case MemoryGrow:
  case TableGet:
    __return_storage_ptr__->kind = Imm_Index_Op_1;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    break;
  case I32Load:
  case I64Load:
  case F32Load:
  case F64Load:
  case I32Load8S:
  case I32Load8U:
  case I32Load16S:
  case I32Load16U:
  case I64Load8S:
  case I64Load8U:
  case I64Load16S:
  case I64Load16U:
  case I64Load32S:
  case I64Load32U:
  case V128Load:
  case V8X16LoadSplat:
  case V16X8LoadSplat:
  case V32X4LoadSplat:
  case V64X2LoadSplat:
  case I16X8Load8X8S:
  case I16X8Load8X8U:
  case I32X4Load16X4S:
  case I32X4Load16X4U:
  case I64X2Load32X2S:
  case I64X2Load32X2U:
  case I32AtomicLoad:
  case I64AtomicLoad:
  case I32AtomicLoad8U:
  case I32AtomicLoad16U:
  case I64AtomicLoad8U:
  case I64AtomicLoad16U:
  case I64AtomicLoad32U:
    __return_storage_ptr__->kind = Imm_Index_Offset_Op_1;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32x2.snd = uVar3;
    break;
  case I32Store:
  case I64Store:
  case F32Store:
  case F64Store:
  case I32Store8:
  case I32Store16:
  case I64Store8:
  case I64Store16:
  case I64Store32:
  case V128Store:
  case AtomicNotify:
  case I32AtomicStore:
  case I64AtomicStore:
  case I32AtomicStore8:
  case I32AtomicStore16:
  case I64AtomicStore8:
  case I64AtomicStore16:
  case I64AtomicStore32:
  case I32AtomicRmwAdd:
  case I64AtomicRmwAdd:
  case I32AtomicRmw8AddU:
  case I32AtomicRmw16AddU:
  case I64AtomicRmw8AddU:
  case I64AtomicRmw16AddU:
  case I64AtomicRmw32AddU:
  case I32AtomicRmwSub:
  case I64AtomicRmwSub:
  case I32AtomicRmw8SubU:
  case I32AtomicRmw16SubU:
  case I64AtomicRmw8SubU:
  case I64AtomicRmw16SubU:
  case I64AtomicRmw32SubU:
  case I32AtomicRmwAnd:
  case I64AtomicRmwAnd:
  case I32AtomicRmw8AndU:
  case I32AtomicRmw16AndU:
  case I64AtomicRmw8AndU:
  case I64AtomicRmw16AndU:
  case I64AtomicRmw32AndU:
  case I32AtomicRmwOr:
  case I64AtomicRmwOr:
  case I32AtomicRmw8OrU:
  case I32AtomicRmw16OrU:
  case I64AtomicRmw8OrU:
  case I64AtomicRmw16OrU:
  case I64AtomicRmw32OrU:
  case I32AtomicRmwXor:
  case I64AtomicRmwXor:
  case I32AtomicRmw8XorU:
  case I32AtomicRmw16XorU:
  case I64AtomicRmw8XorU:
  case I64AtomicRmw16XorU:
  case I64AtomicRmw32XorU:
  case I32AtomicRmwXchg:
  case I64AtomicRmwXchg:
  case I32AtomicRmw8XchgU:
  case I32AtomicRmw16XchgU:
  case I64AtomicRmw8XchgU:
  case I64AtomicRmw16XchgU:
  case I64AtomicRmw32XchgU:
    __return_storage_ptr__->kind = Imm_Index_Offset_Op_2;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32x2.snd = uVar3;
    break;
  case I32Const:
  case InterpAlloca:
    __return_storage_ptr__->kind = Imm_I32_Op_0;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    break;
  case I64Const:
    __return_storage_ptr__->kind = Imm_I64_Op_0;
    uVar4 = ReadAt<unsigned_long>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u64 = uVar4;
    break;
  case F32Const:
    __return_storage_ptr__->kind = Imm_F32_Op_0;
    fVar5 = ReadAt<float>(this,local_18);
    (__return_storage_ptr__->field_2).imm_f32 = (f32)fVar5;
    break;
  case F64Const:
    __return_storage_ptr__->kind = Imm_F64_Op_0;
    dVar6 = ReadAt<double>(this,local_18);
    (__return_storage_ptr__->field_2).imm_f64 = (f64)dVar6;
    break;
  case I32Eqz:
  case I64Eqz:
  case I32Clz:
  case I32Ctz:
  case I32Popcnt:
  case I64Clz:
  case I64Ctz:
  case I64Popcnt:
  case F32Abs:
  case F32Neg:
  case F32Ceil:
  case F32Floor:
  case F32Trunc:
  case F32Nearest:
  case F32Sqrt:
  case F64Abs:
  case F64Neg:
  case F64Ceil:
  case F64Floor:
  case F64Trunc:
  case F64Nearest:
  case F64Sqrt:
  case I32WrapI64:
  case I32TruncF32S:
  case I32TruncF32U:
  case I32TruncF64S:
  case I32TruncF64U:
  case I64ExtendI32S:
  case I64ExtendI32U:
  case I64TruncF32S:
  case I64TruncF32U:
  case I64TruncF64S:
  case I64TruncF64U:
  case F32ConvertI32S:
  case F32ConvertI32U:
  case F32ConvertI64S:
  case F32ConvertI64U:
  case F32DemoteF64:
  case F64ConvertI32S:
  case F64ConvertI32U:
  case F64ConvertI64S:
  case F64ConvertI64U:
  case F64PromoteF32:
  case I32ReinterpretF32:
  case I64ReinterpretF64:
  case F32ReinterpretI32:
  case F64ReinterpretI64:
  case I32Extend8S:
  case I32Extend16S:
  case I64Extend8S:
  case I64Extend16S:
  case I64Extend32S:
  case I32TruncSatF32S:
  case I32TruncSatF32U:
  case I32TruncSatF64S:
  case I32TruncSatF64U:
  case I64TruncSatF32S:
  case I64TruncSatF32U:
  case I64TruncSatF64S:
  case I64TruncSatF64U:
  case RefIsNull:
  case I8X16Splat:
  case I16X8Splat:
  case I32X4Splat:
  case I64X2Splat:
  case F32X4Splat:
  case F64X2Splat:
  case V128Not:
  case I8X16Neg:
  case I8X16AnyTrue:
  case I8X16AllTrue:
  case I16X8Neg:
  case I16X8AnyTrue:
  case I16X8AllTrue:
  case I32X4Neg:
  case I32X4AnyTrue:
  case I32X4AllTrue:
  case I64X2Neg:
  case F32X4Abs:
  case F32X4Neg:
  case F32X4Sqrt:
  case F64X2Abs:
  case F64X2Neg:
  case F64X2Sqrt:
  case I32X4TruncSatF32X4S:
  case I32X4TruncSatF32X4U:
  case F32X4ConvertI32X4S:
  case F32X4ConvertI32X4U:
  case I16X8WidenLowI8X16S:
  case I16X8WidenHighI8X16S:
  case I16X8WidenLowI8X16U:
  case I16X8WidenHighI8X16U:
  case I32X4WidenLowI16X8S:
  case I32X4WidenHighI16X8S:
  case I32X4WidenLowI16X8U:
  case I32X4WidenHighI16X8U:
  case I8X16Abs:
  case I16X8Abs:
  case I32X4Abs:
    __return_storage_ptr__->kind = Imm_0_Op_1;
    break;
  case I32Eq:
  case I32Ne:
  case I32LtS:
  case I32LtU:
  case I32GtS:
  case I32GtU:
  case I32LeS:
  case I32LeU:
  case I32GeS:
  case I32GeU:
  case I64Eq:
  case I64Ne:
  case I64LtS:
  case I64LtU:
  case I64GtS:
  case I64GtU:
  case I64LeS:
  case I64LeU:
  case I64GeS:
  case I64GeU:
  case F32Eq:
  case F32Ne:
  case F32Lt:
  case F32Gt:
  case F32Le:
  case F32Ge:
  case F64Eq:
  case F64Ne:
  case F64Lt:
  case F64Gt:
  case F64Le:
  case F64Ge:
  case I32Add:
  case I32Sub:
  case I32Mul:
  case I32DivS:
  case I32DivU:
  case I32RemS:
  case I32RemU:
  case I32And:
  case I32Or:
  case I32Xor:
  case I32Shl:
  case I32ShrS:
  case I32ShrU:
  case I32Rotl:
  case I32Rotr:
  case I64Add:
  case I64Sub:
  case I64Mul:
  case I64DivS:
  case I64DivU:
  case I64RemS:
  case I64RemU:
  case I64And:
  case I64Or:
  case I64Xor:
  case I64Shl:
  case I64ShrS:
  case I64ShrU:
  case I64Rotl:
  case I64Rotr:
  case F32Add:
  case F32Sub:
  case F32Mul:
  case F32Div:
  case F32Min:
  case F32Max:
  case F32Copysign:
  case F64Add:
  case F64Sub:
  case F64Mul:
  case F64Div:
  case F64Min:
  case F64Max:
  case F64Copysign:
  case I8X16Eq:
  case I8X16Ne:
  case I8X16LtS:
  case I8X16LtU:
  case I8X16GtS:
  case I8X16GtU:
  case I8X16LeS:
  case I8X16LeU:
  case I8X16GeS:
  case I8X16GeU:
  case I16X8Eq:
  case I16X8Ne:
  case I16X8LtS:
  case I16X8LtU:
  case I16X8GtS:
  case I16X8GtU:
  case I16X8LeS:
  case I16X8LeU:
  case I16X8GeS:
  case I16X8GeU:
  case I32X4Eq:
  case I32X4Ne:
  case I32X4LtS:
  case I32X4LtU:
  case I32X4GtS:
  case I32X4GtU:
  case I32X4LeS:
  case I32X4LeU:
  case I32X4GeS:
  case I32X4GeU:
  case F32X4Eq:
  case F32X4Ne:
  case F32X4Lt:
  case F32X4Gt:
  case F32X4Le:
  case F32X4Ge:
  case F64X2Eq:
  case F64X2Ne:
  case F64X2Lt:
  case F64X2Gt:
  case F64X2Le:
  case F64X2Ge:
  case V128And:
  case V128Or:
  case V128Xor:
  case V128BitSelect:
  case I8X16Shl:
  case I8X16ShrS:
  case I8X16ShrU:
  case I8X16Add:
  case I8X16AddSaturateS:
  case I8X16AddSaturateU:
  case I8X16Sub:
  case I8X16SubSaturateS:
  case I8X16SubSaturateU:
  case I8X16MinS:
  case I8X16MinU:
  case I8X16MaxS:
  case I8X16MaxU:
  case I16X8Shl:
  case I16X8ShrS:
  case I16X8ShrU:
  case I16X8Add:
  case I16X8AddSaturateS:
  case I16X8AddSaturateU:
  case I16X8Sub:
  case I16X8SubSaturateS:
  case I16X8SubSaturateU:
  case I16X8Mul:
  case I16X8MinS:
  case I16X8MinU:
  case I16X8MaxS:
  case I16X8MaxU:
  case I32X4Shl:
  case I32X4ShrS:
  case I32X4ShrU:
  case I32X4Add:
  case I32X4Sub:
  case I32X4Mul:
  case I32X4MinS:
  case I32X4MinU:
  case I32X4MaxS:
  case I32X4MaxU:
  case I64X2Shl:
  case I64X2ShrS:
  case I64X2ShrU:
  case I64X2Add:
  case I64X2Sub:
  case I64X2Mul:
  case F32X4Add:
  case F32X4Sub:
  case F32X4Mul:
  case F32X4Div:
  case F32X4Min:
  case F32X4Max:
  case F64X2Add:
  case F64X2Sub:
  case F64X2Mul:
  case F64X2Div:
  case F64X2Min:
  case F64X2Max:
  case V8X16Swizzle:
  case I8X16NarrowI16X8S:
  case I8X16NarrowI16X8U:
  case I16X8NarrowI32X4S:
  case I16X8NarrowI32X4U:
  case V128Andnot:
  case I8X16AvgrU:
  case I16X8AvgrU:
    __return_storage_ptr__->kind = Imm_0_Op_2;
    break;
  case InterpDropKeep:
    __return_storage_ptr__->kind = Imm_I32_I32_Op_0;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32x2.snd = uVar3;
    break;
  case MemoryInit:
  case MemoryCopy:
  case TableInit:
  case TableCopy:
    __return_storage_ptr__->kind = Imm_Index_Index_Op_3;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32x2.snd = uVar3;
    break;
  case MemoryFill:
  case TableFill:
    __return_storage_ptr__->kind = Imm_Index_Op_3;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    break;
  case TableSet:
  case TableGrow:
    __return_storage_ptr__->kind = Imm_Index_Op_2;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    break;
  case V128Const:
    __return_storage_ptr__->kind = Imm_V128_Op_0;
    vVar7 = ReadAt<v128>(this,local_18);
    local_2c = vVar7.v._0_8_;
    (__return_storage_ptr__->field_2).imm_u64 = local_2c;
    local_24 = vVar7.v._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_24;
    break;
  case V8X16Shuffle:
    __return_storage_ptr__->kind = Imm_V128_Op_2;
    vVar7 = ReadAt<v128>(this,local_18);
    local_3c = vVar7.v._0_8_;
    (__return_storage_ptr__->field_2).imm_u64 = local_3c;
    local_34 = vVar7.v._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_34;
    break;
  case I8X16ExtractLaneS:
  case I8X16ExtractLaneU:
  case I16X8ExtractLaneS:
  case I16X8ExtractLaneU:
  case I32X4ExtractLane:
  case I64X2ExtractLane:
  case F32X4ExtractLane:
  case F64X2ExtractLane:
    __return_storage_ptr__->kind = Imm_I8_Op_1;
    uVar1 = ReadAt<unsigned_char>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u8 = uVar1;
    break;
  case I8X16ReplaceLane:
  case I16X8ReplaceLane:
  case I32X4ReplaceLane:
  case I64X2ReplaceLane:
  case F32X4ReplaceLane:
  case F64X2ReplaceLane:
    __return_storage_ptr__->kind = Imm_I8_Op_2;
    uVar1 = ReadAt<unsigned_char>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u8 = uVar1;
    break;
  case I32AtomicWait:
  case I64AtomicWait:
  case I32AtomicRmwCmpxchg:
  case I64AtomicRmwCmpxchg:
  case I32AtomicRmw8CmpxchgU:
  case I32AtomicRmw16CmpxchgU:
  case I64AtomicRmw8CmpxchgU:
  case I64AtomicRmw16CmpxchgU:
  case I64AtomicRmw32CmpxchgU:
    __return_storage_ptr__->kind = Imm_Index_Offset_Op_3;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32 = uVar3;
    uVar3 = ReadAt<unsigned_int>(this,local_18);
    (__return_storage_ptr__->field_2).imm_u32x2.snd = uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

Instr Istream::Read(Offset* offset) const {
  Instr instr;
  instr.op = static_cast<Opcode::Enum>(ReadAt<SerializedOpcode>(offset));

  switch (instr.op) {
    case Opcode::Drop:
    case Opcode::Nop:
    case Opcode::Return:
    case Opcode::Unreachable:
    case Opcode::RefNull:
      // 0 immediates, 0 operands.
      instr.kind = InstrKind::Imm_0_Op_0;
      break;

    case Opcode::F32Abs:
    case Opcode::F32Ceil:
    case Opcode::F32ConvertI32S:
    case Opcode::F32ConvertI32U:
    case Opcode::F32ConvertI64S:
    case Opcode::F32ConvertI64U:
    case Opcode::F32DemoteF64:
    case Opcode::F32Floor:
    case Opcode::F32Nearest:
    case Opcode::F32Neg:
    case Opcode::F32ReinterpretI32:
    case Opcode::F32Sqrt:
    case Opcode::F32Trunc:
    case Opcode::F32X4Abs:
    case Opcode::F32X4ConvertI32X4S:
    case Opcode::F32X4ConvertI32X4U:
    case Opcode::F32X4Neg:
    case Opcode::F32X4Splat:
    case Opcode::F32X4Sqrt:
    case Opcode::F64Abs:
    case Opcode::F64Ceil:
    case Opcode::F64ConvertI32S:
    case Opcode::F64ConvertI32U:
    case Opcode::F64ConvertI64S:
    case Opcode::F64ConvertI64U:
    case Opcode::F64Floor:
    case Opcode::F64Nearest:
    case Opcode::F64Neg:
    case Opcode::F64PromoteF32:
    case Opcode::F64ReinterpretI64:
    case Opcode::F64Sqrt:
    case Opcode::F64Trunc:
    case Opcode::F64X2Abs:
    case Opcode::F64X2Neg:
    case Opcode::F64X2Splat:
    case Opcode::F64X2Sqrt:
    case Opcode::I16X8AllTrue:
    case Opcode::I16X8AnyTrue:
    case Opcode::I16X8Neg:
    case Opcode::I16X8Splat:
    case Opcode::I16X8WidenHighI8X16S:
    case Opcode::I16X8WidenHighI8X16U:
    case Opcode::I16X8WidenLowI8X16S:
    case Opcode::I16X8WidenLowI8X16U:
    case Opcode::I32Clz:
    case Opcode::I32Ctz:
    case Opcode::I32Eqz:
    case Opcode::I32Extend16S:
    case Opcode::I32Extend8S:
    case Opcode::I32Popcnt:
    case Opcode::I32ReinterpretF32:
    case Opcode::I32TruncF32S:
    case Opcode::I32TruncF32U:
    case Opcode::I32TruncF64S:
    case Opcode::I32TruncF64U:
    case Opcode::I32TruncSatF32S:
    case Opcode::I32TruncSatF32U:
    case Opcode::I32TruncSatF64S:
    case Opcode::I32TruncSatF64U:
    case Opcode::I32WrapI64:
    case Opcode::I32X4AllTrue:
    case Opcode::I32X4AnyTrue:
    case Opcode::I32X4Neg:
    case Opcode::I32X4Splat:
    case Opcode::I32X4TruncSatF32X4S:
    case Opcode::I32X4TruncSatF32X4U:
    case Opcode::I32X4WidenHighI16X8S:
    case Opcode::I32X4WidenHighI16X8U:
    case Opcode::I32X4WidenLowI16X8S:
    case Opcode::I32X4WidenLowI16X8U:
    case Opcode::I64Clz:
    case Opcode::I64Ctz:
    case Opcode::I64Eqz:
    case Opcode::I64Extend16S:
    case Opcode::I64Extend32S:
    case Opcode::I64Extend8S:
    case Opcode::I64ExtendI32S:
    case Opcode::I64ExtendI32U:
    case Opcode::I64Popcnt:
    case Opcode::I64ReinterpretF64:
    case Opcode::I64TruncF32S:
    case Opcode::I64TruncF32U:
    case Opcode::I64TruncF64S:
    case Opcode::I64TruncF64U:
    case Opcode::I64TruncSatF32S:
    case Opcode::I64TruncSatF32U:
    case Opcode::I64TruncSatF64S:
    case Opcode::I64TruncSatF64U:
    case Opcode::I64X2Neg:
    case Opcode::I64X2Splat:
    case Opcode::I8X16AllTrue:
    case Opcode::I8X16AnyTrue:
    case Opcode::I8X16Neg:
    case Opcode::I8X16Splat:
    case Opcode::RefIsNull:
    case Opcode::V128Not:
    case Opcode::I8X16Abs:
    case Opcode::I16X8Abs:
    case Opcode::I32X4Abs:
      // 0 immediates, 1 operand.
      instr.kind = InstrKind::Imm_0_Op_1;
      break;

    case Opcode::F32Add:
    case Opcode::F32Copysign:
    case Opcode::F32Div:
    case Opcode::F32Eq:
    case Opcode::F32Ge:
    case Opcode::F32Gt:
    case Opcode::F32Le:
    case Opcode::F32Lt:
    case Opcode::F32Max:
    case Opcode::F32Min:
    case Opcode::F32Mul:
    case Opcode::F32Ne:
    case Opcode::F32Sub:
    case Opcode::F32X4Add:
    case Opcode::F32X4Div:
    case Opcode::F32X4Eq:
    case Opcode::F32X4Ge:
    case Opcode::F32X4Gt:
    case Opcode::F32X4Le:
    case Opcode::F32X4Lt:
    case Opcode::F32X4Max:
    case Opcode::F32X4Min:
    case Opcode::F32X4Mul:
    case Opcode::F32X4Ne:
    case Opcode::F32X4Sub:
    case Opcode::F64Add:
    case Opcode::F64Copysign:
    case Opcode::F64Div:
    case Opcode::F64Eq:
    case Opcode::F64Ge:
    case Opcode::F64Gt:
    case Opcode::F64Le:
    case Opcode::F64Lt:
    case Opcode::F64Max:
    case Opcode::F64Min:
    case Opcode::F64Mul:
    case Opcode::F64Ne:
    case Opcode::F64Sub:
    case Opcode::F64X2Add:
    case Opcode::F64X2Div:
    case Opcode::F64X2Eq:
    case Opcode::F64X2Ge:
    case Opcode::F64X2Gt:
    case Opcode::F64X2Le:
    case Opcode::F64X2Lt:
    case Opcode::F64X2Max:
    case Opcode::F64X2Min:
    case Opcode::F64X2Mul:
    case Opcode::F64X2Ne:
    case Opcode::F64X2Sub:
    case Opcode::I16X8Add:
    case Opcode::I16X8AddSaturateS:
    case Opcode::I16X8AddSaturateU:
    case Opcode::I16X8AvgrU:
    case Opcode::I16X8Eq:
    case Opcode::I16X8GeS:
    case Opcode::I16X8GeU:
    case Opcode::I16X8GtS:
    case Opcode::I16X8GtU:
    case Opcode::I16X8LeS:
    case Opcode::I16X8LeU:
    case Opcode::I16X8LtS:
    case Opcode::I16X8LtU:
    case Opcode::I16X8MaxS:
    case Opcode::I16X8MaxU:
    case Opcode::I16X8MinS:
    case Opcode::I16X8MinU:
    case Opcode::I16X8Mul:
    case Opcode::I16X8NarrowI32X4S:
    case Opcode::I16X8NarrowI32X4U:
    case Opcode::I16X8Ne:
    case Opcode::I16X8Shl:
    case Opcode::I16X8ShrS:
    case Opcode::I16X8ShrU:
    case Opcode::I16X8Sub:
    case Opcode::I16X8SubSaturateS:
    case Opcode::I16X8SubSaturateU:
    case Opcode::I32Add:
    case Opcode::I32And:
    case Opcode::I32DivS:
    case Opcode::I32DivU:
    case Opcode::I32Eq:
    case Opcode::I32GeS:
    case Opcode::I32GeU:
    case Opcode::I32GtS:
    case Opcode::I32GtU:
    case Opcode::I32LeS:
    case Opcode::I32LeU:
    case Opcode::I32LtS:
    case Opcode::I32LtU:
    case Opcode::I32Mul:
    case Opcode::I32Ne:
    case Opcode::I32Or:
    case Opcode::I32RemS:
    case Opcode::I32RemU:
    case Opcode::I32Rotl:
    case Opcode::I32Rotr:
    case Opcode::I32Shl:
    case Opcode::I32ShrS:
    case Opcode::I32ShrU:
    case Opcode::I32Sub:
    case Opcode::I32X4Add:
    case Opcode::I32X4Eq:
    case Opcode::I32X4GeS:
    case Opcode::I32X4GeU:
    case Opcode::I32X4GtS:
    case Opcode::I32X4GtU:
    case Opcode::I32X4LeS:
    case Opcode::I32X4LeU:
    case Opcode::I32X4LtS:
    case Opcode::I32X4LtU:
    case Opcode::I32X4MaxS:
    case Opcode::I32X4MaxU:
    case Opcode::I32X4MinS:
    case Opcode::I32X4MinU:
    case Opcode::I32X4Mul:
    case Opcode::I32X4Ne:
    case Opcode::I32X4Shl:
    case Opcode::I32X4ShrS:
    case Opcode::I32X4ShrU:
    case Opcode::I32X4Sub:
    case Opcode::I32Xor:
    case Opcode::I64Add:
    case Opcode::I64And:
    case Opcode::I64DivS:
    case Opcode::I64DivU:
    case Opcode::I64Eq:
    case Opcode::I64GeS:
    case Opcode::I64GeU:
    case Opcode::I64GtS:
    case Opcode::I64GtU:
    case Opcode::I64LeS:
    case Opcode::I64LeU:
    case Opcode::I64LtS:
    case Opcode::I64LtU:
    case Opcode::I64Mul:
    case Opcode::I64Ne:
    case Opcode::I64Or:
    case Opcode::I64RemS:
    case Opcode::I64RemU:
    case Opcode::I64Rotl:
    case Opcode::I64Rotr:
    case Opcode::I64Shl:
    case Opcode::I64ShrS:
    case Opcode::I64ShrU:
    case Opcode::I64Sub:
    case Opcode::I64X2Add:
    case Opcode::I64X2Shl:
    case Opcode::I64X2ShrS:
    case Opcode::I64X2ShrU:
    case Opcode::I64X2Sub:
    case Opcode::I64X2Mul:
    case Opcode::I64Xor:
    case Opcode::I8X16Add:
    case Opcode::I8X16AddSaturateS:
    case Opcode::I8X16AddSaturateU:
    case Opcode::I8X16AvgrU:
    case Opcode::I8X16Eq:
    case Opcode::I8X16GeS:
    case Opcode::I8X16GeU:
    case Opcode::I8X16GtS:
    case Opcode::I8X16GtU:
    case Opcode::I8X16LeS:
    case Opcode::I8X16LeU:
    case Opcode::I8X16LtS:
    case Opcode::I8X16LtU:
    case Opcode::I8X16MaxS:
    case Opcode::I8X16MaxU:
    case Opcode::I8X16MinS:
    case Opcode::I8X16MinU:
    case Opcode::I8X16NarrowI16X8S:
    case Opcode::I8X16NarrowI16X8U:
    case Opcode::I8X16Ne:
    case Opcode::I8X16Shl:
    case Opcode::I8X16ShrS:
    case Opcode::I8X16ShrU:
    case Opcode::I8X16Sub:
    case Opcode::I8X16SubSaturateS:
    case Opcode::I8X16SubSaturateU:
    case Opcode::V128And:
    case Opcode::V128Andnot:
    case Opcode::V128BitSelect:
    case Opcode::V128Or:
    case Opcode::V128Xor:
    case Opcode::V8X16Swizzle:
      // 0 immediates, 2 operands
      instr.kind = InstrKind::Imm_0_Op_2;
      break;

    case Opcode::Select:
    case Opcode::SelectT:
      // 0 immediates, 3 operands
      instr.kind = InstrKind::Imm_0_Op_3;
      break;

    case Opcode::Br:
      // Jump target immediate, 0 operands.
      instr.kind = InstrKind::Imm_Jump_Op_0;
      instr.imm_u32 = ReadAt<u32>(offset);
      break;

    case Opcode::BrIf:
    case Opcode::BrTable:
    case Opcode::InterpBrUnless:
      // Jump target immediate, 1 operand.
      instr.kind = InstrKind::Imm_Jump_Op_1;
      instr.imm_u32 = ReadAt<u32>(offset);
      break;

    case Opcode::GlobalGet:
    case Opcode::LocalGet:
    case Opcode::MemorySize:
    case Opcode::TableSize:
    case Opcode::DataDrop:
    case Opcode::ElemDrop:
    case Opcode::RefFunc:
      // Index immediate, 0 operands.
      instr.kind = InstrKind::Imm_Index_Op_0;
      instr.imm_u32 = ReadAt<u32>(offset);
      break;

    case Opcode::GlobalSet:
    case Opcode::LocalSet:
    case Opcode::LocalTee:
    case Opcode::MemoryGrow:
    case Opcode::TableGet:
      // Index immediate, 1 operand.
      instr.kind = InstrKind::Imm_Index_Op_1;
      instr.imm_u32 = ReadAt<u32>(offset);
      break;

    case Opcode::TableSet:
    case Opcode::TableGrow:
      // Index immediate, 2 operands.
      instr.kind = InstrKind::Imm_Index_Op_2;
      instr.imm_u32 = ReadAt<u32>(offset);
      break;

    case Opcode::MemoryFill:
    case Opcode::TableFill:
      // Index immediate, 3 operands.
      instr.kind = InstrKind::Imm_Index_Op_3;
      instr.imm_u32 = ReadAt<u32>(offset);
      break;

    case Opcode::Call:
    case Opcode::InterpCallImport:
      instr.kind = InstrKind::Imm_Index_Op_N;
      instr.imm_u32 = ReadAt<u32>(offset);
      break;

    case Opcode::CallIndirect:
    case Opcode::ReturnCallIndirect:
      // Index immediate, N operands.
      instr.kind = InstrKind::Imm_Index_Index_Op_N;
      instr.imm_u32x2.fst = ReadAt<u32>(offset);
      instr.imm_u32x2.snd = ReadAt<u32>(offset);
      break;

    case Opcode::MemoryInit:
    case Opcode::TableInit:
    case Opcode::MemoryCopy:
    case Opcode::TableCopy:
      // Index + index immediates, 3 operands.
      instr.kind = InstrKind::Imm_Index_Index_Op_3;
      instr.imm_u32x2.fst = ReadAt<u32>(offset);
      instr.imm_u32x2.snd = ReadAt<u32>(offset);
      break;

    case Opcode::F32Load:
    case Opcode::F64Load:
    case Opcode::I16X8Load8X8S:
    case Opcode::I16X8Load8X8U:
    case Opcode::V16X8LoadSplat:
    case Opcode::I32AtomicLoad:
    case Opcode::I32AtomicLoad16U:
    case Opcode::I32AtomicLoad8U:
    case Opcode::I32Load:
    case Opcode::I32Load16S:
    case Opcode::I32Load16U:
    case Opcode::I32Load8S:
    case Opcode::I32Load8U:
    case Opcode::I32X4Load16X4S:
    case Opcode::I32X4Load16X4U:
    case Opcode::V32X4LoadSplat:
    case Opcode::I64AtomicLoad:
    case Opcode::I64AtomicLoad16U:
    case Opcode::I64AtomicLoad32U:
    case Opcode::I64AtomicLoad8U:
    case Opcode::I64Load:
    case Opcode::I64Load16S:
    case Opcode::I64Load16U:
    case Opcode::I64Load32S:
    case Opcode::I64Load32U:
    case Opcode::I64Load8S:
    case Opcode::I64Load8U:
    case Opcode::I64X2Load32X2S:
    case Opcode::I64X2Load32X2U:
    case Opcode::V64X2LoadSplat:
    case Opcode::V8X16LoadSplat:
    case Opcode::V128Load:
      // Index + memory offset immediates, 1 operand.
      instr.kind = InstrKind::Imm_Index_Offset_Op_1;
      instr.imm_u32x2.fst = ReadAt<u32>(offset);
      instr.imm_u32x2.snd = ReadAt<u32>(offset);
      break;

    case Opcode::AtomicNotify:
    case Opcode::F32Store:
    case Opcode::F64Store:
    case Opcode::I32AtomicRmw16AddU:
    case Opcode::I32AtomicRmw16AndU:
    case Opcode::I32AtomicRmw16OrU:
    case Opcode::I32AtomicRmw16SubU:
    case Opcode::I32AtomicRmw16XchgU:
    case Opcode::I32AtomicRmw16XorU:
    case Opcode::I32AtomicRmw8AddU:
    case Opcode::I32AtomicRmw8AndU:
    case Opcode::I32AtomicRmw8OrU:
    case Opcode::I32AtomicRmw8SubU:
    case Opcode::I32AtomicRmw8XchgU:
    case Opcode::I32AtomicRmw8XorU:
    case Opcode::I32AtomicRmwAdd:
    case Opcode::I32AtomicRmwAnd:
    case Opcode::I32AtomicRmwOr:
    case Opcode::I32AtomicRmwSub:
    case Opcode::I32AtomicRmwXchg:
    case Opcode::I32AtomicRmwXor:
    case Opcode::I32AtomicStore:
    case Opcode::I32AtomicStore16:
    case Opcode::I32AtomicStore8:
    case Opcode::I32Store:
    case Opcode::I32Store16:
    case Opcode::I32Store8:
    case Opcode::I64AtomicRmw16AddU:
    case Opcode::I64AtomicRmw16AndU:
    case Opcode::I64AtomicRmw16OrU:
    case Opcode::I64AtomicRmw16SubU:
    case Opcode::I64AtomicRmw16XchgU:
    case Opcode::I64AtomicRmw16XorU:
    case Opcode::I64AtomicRmw32AddU:
    case Opcode::I64AtomicRmw32AndU:
    case Opcode::I64AtomicRmw32OrU:
    case Opcode::I64AtomicRmw32SubU:
    case Opcode::I64AtomicRmw32XchgU:
    case Opcode::I64AtomicRmw32XorU:
    case Opcode::I64AtomicRmw8AddU:
    case Opcode::I64AtomicRmw8AndU:
    case Opcode::I64AtomicRmw8OrU:
    case Opcode::I64AtomicRmw8SubU:
    case Opcode::I64AtomicRmw8XchgU:
    case Opcode::I64AtomicRmw8XorU:
    case Opcode::I64AtomicRmwAdd:
    case Opcode::I64AtomicRmwAnd:
    case Opcode::I64AtomicRmwOr:
    case Opcode::I64AtomicRmwSub:
    case Opcode::I64AtomicRmwXchg:
    case Opcode::I64AtomicRmwXor:
    case Opcode::I64AtomicStore:
    case Opcode::I64AtomicStore16:
    case Opcode::I64AtomicStore32:
    case Opcode::I64AtomicStore8:
    case Opcode::I64Store:
    case Opcode::I64Store16:
    case Opcode::I64Store32:
    case Opcode::I64Store8:
    case Opcode::V128Store:
      // Index and memory offset immediates, 2 operands.
      instr.kind = InstrKind::Imm_Index_Offset_Op_2;
      instr.imm_u32x2.fst = ReadAt<u32>(offset);
      instr.imm_u32x2.snd = ReadAt<u32>(offset);
      break;

    case Opcode::I32AtomicRmw16CmpxchgU:
    case Opcode::I32AtomicRmw8CmpxchgU:
    case Opcode::I32AtomicRmwCmpxchg:
    case Opcode::I32AtomicWait:
    case Opcode::I64AtomicRmw16CmpxchgU:
    case Opcode::I64AtomicRmw32CmpxchgU:
    case Opcode::I64AtomicRmw8CmpxchgU:
    case Opcode::I64AtomicRmwCmpxchg:
    case Opcode::I64AtomicWait:
      // Index and memory offset immediates, 3 operands.
      instr.kind = InstrKind::Imm_Index_Offset_Op_3;
      instr.imm_u32x2.fst = ReadAt<u32>(offset);
      instr.imm_u32x2.snd = ReadAt<u32>(offset);
      break;

    case Opcode::I32Const:
    case Opcode::InterpAlloca:
      // i32/f32 immediate, 0 operands.
      instr.kind = InstrKind::Imm_I32_Op_0;
      instr.imm_u32 = ReadAt<u32>(offset);
      break;

    case Opcode::I64Const:
      // i64 immediate, 0 operands.
      instr.kind = InstrKind::Imm_I64_Op_0;
      instr.imm_u64 = ReadAt<u64>(offset);
      break;

    case Opcode::F32Const:
      // f32 immediate, 0 operands.
      instr.kind = InstrKind::Imm_F32_Op_0;
      instr.imm_f32 = ReadAt<f32>(offset);
      break;

    case Opcode::F64Const:
      // f64 immediate, 0 operands.
      instr.kind = InstrKind::Imm_F64_Op_0;
      instr.imm_f64 = ReadAt<f64>(offset);
      break;

    case Opcode::InterpDropKeep:
      // i32 and i32 immediates, 0 operands.
      instr.kind = InstrKind::Imm_I32_I32_Op_0;
      instr.imm_u32x2.fst = ReadAt<u32>(offset);
      instr.imm_u32x2.snd = ReadAt<u32>(offset);
      break;

    case Opcode::I8X16ExtractLaneS:
    case Opcode::I8X16ExtractLaneU:
    case Opcode::I16X8ExtractLaneS:
    case Opcode::I16X8ExtractLaneU:
    case Opcode::I32X4ExtractLane:
    case Opcode::I64X2ExtractLane:
    case Opcode::F32X4ExtractLane:
    case Opcode::F64X2ExtractLane:
      // u8 immediate, 1 operand.
      instr.kind = InstrKind::Imm_I8_Op_1;
      instr.imm_u8 = ReadAt<u8>(offset);
      break;

    case Opcode::I8X16ReplaceLane:
    case Opcode::I16X8ReplaceLane:
    case Opcode::I32X4ReplaceLane:
    case Opcode::I64X2ReplaceLane:
    case Opcode::F32X4ReplaceLane:
    case Opcode::F64X2ReplaceLane:
      // u8 immediate, 2 operands.
      instr.kind = InstrKind::Imm_I8_Op_2;
      instr.imm_u8 = ReadAt<u8>(offset);
      break;

    case Opcode::V128Const:
      // v128 immediate, 0 operands.
      instr.kind = InstrKind::Imm_V128_Op_0;
      instr.imm_v128 = ReadAt<v128>(offset);
      break;

    case Opcode::V8X16Shuffle:
      // v128 immediate, 2 operands.
      instr.kind = InstrKind::Imm_V128_Op_2;
      instr.imm_v128 = ReadAt<v128>(offset);
      break;

    case Opcode::Block:
    case Opcode::BrOnExn:
    case Opcode::Catch:
    case Opcode::Else:
    case Opcode::End:
    case Opcode::If:
    case Opcode::InterpData:
    case Opcode::Invalid:
    case Opcode::Loop:
    case Opcode::Rethrow:
    case Opcode::Throw:
    case Opcode::Try:
    case Opcode::ReturnCall:
      // Not used.
      break;
  }
  return instr;
}